

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void canvas_menusave(_glist *x,t_float fdestroy)

{
  t_symbol *filename;
  char *__s1;
  int iVar1;
  _glist *in_RAX;
  _glist *x_00;
  size_t sVar2;
  t_symbol *dir;
  
  x_00 = canvas_getrootfor(in_RAX);
  filename = x_00->gl_name;
  __s1 = filename->s_name;
  if (*__s1 != '\0') {
    iVar1 = strncmp(__s1,"PDUNTITLED",10);
    if (iVar1 != 0) {
      sVar2 = strlen(__s1);
      if (3 < sVar2) {
        iVar1 = strcmp(__s1 + (sVar2 - 4),".pat");
        if (iVar1 == 0) {
          iVar1 = strcmp(__s1 + (sVar2 - 4),".mxt");
          if (iVar1 == 0) goto LAB_001531d8;
        }
      }
      dir = canvas_getdir(x_00);
      canvas_savetofile(x_00,filename,dir,fdestroy);
      return;
    }
  }
LAB_001531d8:
  canvas_menusaveas(x_00,fdestroy);
  return;
}

Assistant:

static void canvas_menusave(t_canvas *x, t_float fdestroy)
{
    t_canvas *x2 = canvas_getrootfor(x);
    const char *name = x2->gl_name->s_name;
    if (*name && UNTITLED_STRNCMP(name)
            && (strlen(name) < 4 || strcmp(name + strlen(name)-4, ".pat")
                || strcmp(name + strlen(name)-4, ".mxt")))
    {
        canvas_savetofile(x2, x2->gl_name, canvas_getdir(x2), fdestroy);
    }
    else canvas_menusaveas(x2, fdestroy);
}